

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O1

bool __thiscall Expr::RequiresAnalyzerContext(Expr *this)

{
  ExprType EVar1;
  bool bVar2;
  int iVar3;
  pointer ppCVar4;
  pointer ppEVar5;
  ulong uVar6;
  bool bVar7;
  
  for (; EVar1 = this->expr_type_, EVar1 == EXPR_MEMBER; this = this->operand_[0]) {
  }
  if (EVar1 == EXPR_ID) {
    iVar3 = std::__cxx11::string::compare((char *)&this->id_->name);
    return iVar3 == 0;
  }
  if (EVar1 == EXPR_CALLARGS) {
    if (this->args_ == (ExprList *)0x0) {
      return false;
    }
    ppEVar5 = (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    bVar7 = ppEVar5 ==
            (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar7) {
      return false;
    }
    bVar2 = RequiresAnalyzerContext(*ppEVar5);
    while (!bVar2) {
      ppEVar5 = ppEVar5 + 1;
      bVar7 = ppEVar5 ==
              (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      if (bVar7) {
        return false;
      }
      bVar2 = RequiresAnalyzerContext(*ppEVar5);
    }
  }
  else {
    if (EVar1 != EXPR_CASE) {
      bVar7 = true;
      uVar6 = 0;
      while ((this->operand_[uVar6] == (Expr *)0x0 ||
             (bVar2 = RequiresAnalyzerContext(this->operand_[uVar6]), !bVar2))) {
        bVar7 = uVar6 < 2;
        uVar6 = uVar6 + 1;
        if (uVar6 == 3) {
          return bVar7;
        }
      }
      if (FLAGS_pac_debug == true) {
        fprintf(_stderr,"\'%s\' requires analyzer context\n",
                (this->operand_[uVar6]->orig_)._M_dataplus._M_p);
        return bVar7;
      }
      return bVar7;
    }
    if (this->cases_ == (CaseExprList *)0x0) {
      return false;
    }
    ppCVar4 = (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    bVar7 = ppCVar4 ==
            (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar7) {
      return false;
    }
    bVar2 = RequiresAnalyzerContext((*ppCVar4)->value_);
    while (!bVar2) {
      ppCVar4 = ppCVar4 + 1;
      bVar7 = ppCVar4 ==
              (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      if (bVar7) {
        return false;
      }
      bVar2 = RequiresAnalyzerContext((*ppCVar4)->value_);
    }
  }
  if (bVar7) {
    return false;
  }
  return true;
}

Assistant:

bool Expr::RequiresAnalyzerContext() const
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return *id_ == *analyzer_context_id;

		case EXPR_MEMBER:
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			return operand_[0]->RequiresAnalyzerContext();

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		case EXPR_CASE:
			{
			foreach (i, CaseExprList, cases_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] && operand_[i]->RequiresAnalyzerContext() )
					{
					DEBUG_MSG("'%s' requires analyzer context\n", operand_[i]->orig());
					return true;
					}
			return false;
		}
	}